

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-cave.c
# Opt level: O0

void ensure_connectedness(chunk_conflict *c,_Bool allow_vault_disconnect)

{
  int iVar1;
  int *colors_00;
  int *counts_00;
  int *counts;
  int *colors;
  wchar_t size;
  _Bool allow_vault_disconnect_local;
  chunk_conflict *c_local;
  
  iVar1 = c->height * c->width;
  colors_00 = (int *)mem_zalloc((long)iVar1 << 2);
  counts_00 = (int *)mem_zalloc((long)iVar1 << 2);
  build_colors(c,colors_00,counts_00,(_Bool *)0x0,true);
  join_regions(c,colors_00,counts_00,allow_vault_disconnect);
  mem_free(colors_00);
  mem_free(counts_00);
  return;
}

Assistant:

void ensure_connectedness(struct chunk *c, bool allow_vault_disconnect) {
	int size = c->height * c->width;
	int *colors = mem_zalloc(size * sizeof(int));
	int *counts = mem_zalloc(size * sizeof(int));

	build_colors(c, colors, counts, NULL, true);
	join_regions(c, colors, counts, allow_vault_disconnect);

	mem_free(colors);
	mem_free(counts);
}